

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void testProcrustesWithMatrix<double>(M44d *m)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  Rand48 random;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> toPoints;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> fromPoints;
  V3d fromPt;
  Vec3<double> local_68;
  V3d toPt;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Testing Procrustes algorithm with arbitrary matrix: \n");
  Imath_3_2::operator<<(poVar3,m);
  fromPoints.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  toPoints.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fromPoints.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fromPoints.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  toPoints.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  toPoints.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  random._state[0] = 0x7c67;
  random._state[1] = 0x1005;
  random._state[2] = 0x7c67;
  std::operator<<((ostream *)&std::cout,"   numPoints: ");
  for (lVar4 = 1; lVar4 != 10; lVar4 = lVar4 + 1) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar3," ");
    std::ostream::flush();
    if (fromPoints.
        super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        fromPoints.
        super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      fromPoints.
      super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish =
           fromPoints.
           super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    lVar5 = lVar4;
    if (toPoints.
        super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        toPoints.
        super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      toPoints.
      super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish =
           toPoints.
           super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    while (lVar5 != 0) {
      dVar1 = (double)Imath_3_2::erand48(random._state);
      dVar2 = (double)Imath_3_2::erand48(random._state);
      fromPt.z = (double)Imath_3_2::erand48(random._state);
      fromPt.x = dVar1;
      fromPt.y = dVar2;
      Imath_3_2::operator*(&fromPt,m);
      local_68.x = fromPt.x;
      local_68.y = fromPt.y;
      local_68.z = fromPt.z;
      std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
      emplace_back<Imath_3_2::Vec3<double>>
                ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)
                 &fromPoints,&local_68);
      local_68.x = toPt.x;
      local_68.y = toPt.y;
      local_68.z = toPt.z;
      std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
      emplace_back<Imath_3_2::Vec3<double>>
                ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)
                 &toPoints,&local_68);
      lVar5 = lVar5 + -1;
    }
    verifyProcrustes<double>(&fromPoints,&toPoints);
  }
  std::operator<<((ostream *)&std::cout,"OK\n");
  std::_Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
  ~_Vector_base(&toPoints.
                 super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
               );
  std::_Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
  ~_Vector_base(&fromPoints.
                 super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
               );
  return;
}

Assistant:

void
testProcrustesWithMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing Procrustes algorithm with arbitrary matrix: \n" << m;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> toPoints;

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    std::cout << "   numPoints: ";
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        std::cout << numPoints << " " << std::flush;
        fromPoints.clear ();
        toPoints.clear ();
        for (size_t i = 0; i < numPoints; ++i)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d fromPt (
                random.nextf (), random.nextf (), random.nextf ());
            const IMATH_INTERNAL_NAMESPACE::V3d toPt = fromPt * m;
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (fromPt));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (toPt));
        }
        verifyProcrustes (fromPoints, toPoints);
    }
    std::cout << "OK\n";
}